

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O3

bool_t u64Parity(u64 w)

{
  ulong uVar1;
  
  uVar1 = w >> 1 ^ w;
  uVar1 = uVar1 >> 2 ^ uVar1;
  uVar1 = uVar1 >> 4 ^ uVar1;
  uVar1 = uVar1 >> 8 ^ uVar1;
  uVar1 = uVar1 >> 0x10 ^ uVar1;
  return ((uint)(uVar1 >> 0x20) ^ (uint)uVar1) & 1;
}

Assistant:

bool_t u64Parity(register u64 w)
{
	w ^= w >> 1;
	w ^= w >> 2;
	w ^= w >> 4;
	w ^= w >> 8;
	w ^= w >> 16;
	w ^= w >> 32;
	return (bool_t)(w & U64_1);
}